

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

int Abc_NtkDarSeqSim(Abc_Ntk_t *pNtk,int nFrames,int nWords,int TimeOut,int fNew,int fMiter,
                    int fVerbose,char *pFileSim)

{
  int iVar1;
  uint uVar2;
  abctime aVar3;
  Aig_Man_t *pAig;
  Abc_Cex_t *p;
  abctime aVar4;
  char *pcVar5;
  char *pcVar6;
  Fra_Sml_t *local_80;
  Fra_Sml_t *pSml;
  Gia_ParSim_t *pPars;
  int local_68;
  Gia_ParSim_t Pars;
  Gia_Man_t *pGia;
  abctime clk;
  int RetValue;
  int status;
  Abc_Cex_t *pCex;
  Aig_Man_t *pMan;
  int fMiter_local;
  int fNew_local;
  int TimeOut_local;
  int nWords_local;
  int nFrames_local;
  Abc_Ntk_t *pNtk_local;
  
  clk._0_4_ = -1;
  aVar3 = Abc_Clock();
  iVar1 = Abc_NtkGetChoiceNum(pNtk);
  if (iVar1 != 0) {
    uVar2 = Abc_NtkGetChoiceNum(pNtk);
    Abc_Print(1,"Removing %d choices from the AIG.\n",(ulong)uVar2);
    Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
  }
  pAig = Abc_NtkToDar(pNtk,0,1);
  if (fNew == 0) {
    if (pFileSim == (char *)0x0) {
      iVar1 = Abc_NtkLatchNum(pNtk);
      if (iVar1 == 0) {
        local_80 = Fra_SmlSimulateComb(pAig,nWords,fMiter);
      }
      else {
        local_80 = Fra_SmlSimulateSeq(pAig,0,nFrames,nWords,fMiter);
      }
    }
    else {
      iVar1 = Abc_NtkLatchNum(pNtk);
      if (iVar1 != 0) {
        __assert_fail("Abc_NtkLatchNum(pNtk) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                      ,0xdeb,
                      "int Abc_NtkDarSeqSim(Abc_Ntk_t *, int, int, int, int, int, int, char *)");
      }
      local_80 = Fra_SmlSimulateCombGiven(pAig,pFileSim,fMiter,fVerbose);
    }
    if (local_80->fNonConstOut == 0) {
      Abc_Print(1,"Simulation of %d frames with %d words did not assert the outputs.    ",
                (ulong)(uint)nFrames,(ulong)(uint)nWords);
    }
    else {
      p = Fra_SmlGetCounterExample(local_80);
      if (p != (Abc_Cex_t *)0x0) {
        pcVar5 = "s";
        if (local_80->nFrames == 1) {
          pcVar5 = "";
        }
        pcVar6 = "s";
        if (local_80->nWordsFrame == 1) {
          pcVar6 = "";
        }
        Abc_Print(1,"Simulation of %d frame%s with %d word%s asserted output %d in frame %d. ",
                  (ulong)(uint)local_80->nFrames,pcVar5,(ulong)(uint)local_80->nWordsFrame,pcVar6,
                  p->iPo,p->iFrame);
        iVar1 = Saig_ManVerifyCex(pAig,p);
        if (iVar1 == 0) {
          Abc_Print(1,"Abc_NtkDarSeqSim(): Counter-example verification has FAILED.\n");
        }
      }
      if (pNtk->pModel != (int *)0x0) {
        free(pNtk->pModel);
        pNtk->pModel = (int *)0x0;
      }
      if (pNtk->pSeqModel != (Abc_Cex_t *)0x0) {
        free(pNtk->pSeqModel);
        pNtk->pSeqModel = (Abc_Cex_t *)0x0;
      }
      pNtk->pSeqModel = p;
      clk._0_4_ = 0;
    }
    Fra_SmlStop(local_80);
  }
  else {
    Gia_ManSimSetDefaultParams((Gia_ParSim_t *)((long)&pPars + 4));
    Pars.TimeLimit = fVerbose;
    pPars._4_4_ = nWords;
    local_68 = nFrames;
    Pars.nIters = TimeOut;
    Pars.RandSeed = fMiter;
    Pars._20_8_ = Gia_ManFromAig(pAig);
    iVar1 = Gia_ManSimSimulate((Gia_Man_t *)Pars._20_8_,(Gia_ParSim_t *)((long)&pPars + 4));
    if (iVar1 == 0) {
      Abc_Print(1,"Simulation of %d frames with %d words did not assert the outputs.    ",
                (ulong)(uint)nFrames,(ulong)(uint)nWords);
    }
    else {
      if (*(long *)(Pars._20_8_ + 0x178) != 0) {
        Abc_Print(1,"Simulation of %d frames with %d words asserted output %d in frame %d. ",
                  (ulong)(uint)nFrames,(ulong)(uint)nWords,(ulong)**(uint **)(Pars._20_8_ + 0x178),
                  (ulong)*(uint *)(*(long *)(Pars._20_8_ + 0x178) + 4));
        iVar1 = Saig_ManVerifyCex(pAig,*(Abc_Cex_t **)(Pars._20_8_ + 0x178));
        if (iVar1 == 0) {
          Abc_Print(1,"Abc_NtkDarSeqSim(): Counter-example verification has FAILED.\n");
        }
      }
      if (pNtk->pModel != (int *)0x0) {
        free(pNtk->pModel);
        pNtk->pModel = (int *)0x0;
      }
      if (pNtk->pSeqModel != (Abc_Cex_t *)0x0) {
        free(pNtk->pSeqModel);
        pNtk->pSeqModel = (Abc_Cex_t *)0x0;
      }
      pNtk->pSeqModel = *(Abc_Cex_t **)(Pars._20_8_ + 0x178);
      *(undefined8 *)(Pars._20_8_ + 0x178) = 0;
      clk._0_4_ = 0;
    }
    Gia_ManStop((Gia_Man_t *)Pars._20_8_);
  }
  Abc_Print(1,"%s =","Time");
  aVar4 = Abc_Clock();
  Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - aVar3) * 1.0) / 1000000.0);
  Aig_ManStop(pAig);
  return (int)clk;
}

Assistant:

int Abc_NtkDarSeqSim( Abc_Ntk_t * pNtk, int nFrames, int nWords, int TimeOut, int fNew, int fMiter, int fVerbose, char * pFileSim )
{
    Aig_Man_t * pMan;
    Abc_Cex_t * pCex;
    int status, RetValue = -1;
    abctime clk = Abc_Clock();
    if ( Abc_NtkGetChoiceNum(pNtk) )
    {
        Abc_Print( 1, "Removing %d choices from the AIG.\n", Abc_NtkGetChoiceNum(pNtk) );
        Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
    }
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( fNew )
    {
        Gia_Man_t * pGia;
        Gia_ParSim_t Pars, * pPars = &Pars;
        Gia_ManSimSetDefaultParams( pPars );
        pPars->nWords = nWords;
        pPars->nIters = nFrames;
        pPars->TimeLimit = TimeOut;
        pPars->fCheckMiter = fMiter;
        pPars->fVerbose = fVerbose;
        pGia = Gia_ManFromAig( pMan );
        if ( Gia_ManSimSimulate( pGia, pPars ) )
        { 
            if ( pGia->pCexSeq )
            {
                Abc_Print( 1, "Simulation of %d frames with %d words asserted output %d in frame %d. ", 
                    nFrames, nWords, pGia->pCexSeq->iPo, pGia->pCexSeq->iFrame );
                status = Saig_ManVerifyCex( pMan, pGia->pCexSeq );
                if ( status == 0 )
                    Abc_Print( 1, "Abc_NtkDarSeqSim(): Counter-example verification has FAILED.\n" );
            }
            ABC_FREE( pNtk->pModel );
            ABC_FREE( pNtk->pSeqModel );
            pNtk->pSeqModel = pGia->pCexSeq; pGia->pCexSeq = NULL;
            RetValue = 0;
        }
        else
        {
            Abc_Print( 1, "Simulation of %d frames with %d words did not assert the outputs.    ", 
                nFrames, nWords );
        }
        Gia_ManStop( pGia );
    }
    else // comb/seq simulator
    {
        Fra_Sml_t * pSml;
        if ( pFileSim != NULL )
        {
            assert( Abc_NtkLatchNum(pNtk) == 0 );
            pSml = Fra_SmlSimulateCombGiven( pMan, pFileSim, fMiter, fVerbose );
        }
        else if ( Abc_NtkLatchNum(pNtk) == 0 )
            pSml = Fra_SmlSimulateComb( pMan, nWords, fMiter );
        else
            pSml = Fra_SmlSimulateSeq( pMan, 0, nFrames, nWords, fMiter );
        if ( pSml->fNonConstOut )
        {
            pCex = Fra_SmlGetCounterExample( pSml );
            if ( pCex )
            {
                Abc_Print( 1, "Simulation of %d frame%s with %d word%s asserted output %d in frame %d. ", 
                    pSml->nFrames, pSml->nFrames == 1 ? "": "s", 
                    pSml->nWordsFrame, pSml->nWordsFrame == 1 ? "": "s", 
                    pCex->iPo, pCex->iFrame );
                status = Saig_ManVerifyCex( pMan, pCex );
                if ( status == 0 )
                    Abc_Print( 1, "Abc_NtkDarSeqSim(): Counter-example verification has FAILED.\n" );
            }
            ABC_FREE( pNtk->pModel );
            ABC_FREE( pNtk->pSeqModel );
            pNtk->pSeqModel = pCex;
            RetValue = 0;
        }
        else
        {
            Abc_Print( 1, "Simulation of %d frames with %d words did not assert the outputs.    ", 
                nFrames, nWords );
        }
        Fra_SmlStop( pSml );
    }
    ABC_PRT( "Time", Abc_Clock() - clk );
    Aig_ManStop( pMan );
    return RetValue;
}